

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O0

int create_monster_bottom_up(flatcc_builder_t *B,int flexible)

{
  flatbuffers_ref_t v0;
  flatbuffers_ref_t v0_00;
  MyGame_Sample_Weapon_ref_t ref;
  flatbuffers_uint8_vec_ref_t ref_00;
  MyGame_Sample_Weapon_vec_ref_t ref_01;
  MyGame_Sample_Equipment_union_ref_t uref;
  MyGame_Sample_Equipment_union_ref_t equipped;
  int16_t mana;
  int16_t hp;
  MyGame_Sample_Vec3_t pos;
  MyGame_Sample_Weapon_vec_ref_t weapons;
  flatbuffers_uint8_vec_ref_t inventory;
  uint8_t treasure [10];
  flatbuffers_string_ref_t name;
  MyGame_Sample_Weapon_ref_t axe;
  MyGame_Sample_Weapon_ref_t sword;
  int16_t weapon_two_damage;
  flatbuffers_string_ref_t weapon_two_name;
  int16_t weapon_one_damage;
  flatbuffers_string_ref_t weapon_one_name;
  int flexible_local;
  flatcc_builder_t *B_local;
  
  v0 = flatbuffers_string_create_str(B,"Sword");
  v0_00 = flatbuffers_string_create_str(B,"Axe");
  ref = MyGame_Sample_Weapon_create(B,v0,3);
  treasure._6_4_ = MyGame_Sample_Weapon_create(B,v0_00,5);
  treasure._2_4_ = flatbuffers_string_create_str(B,"Orc");
  stack0xffffffffffffffc6 = 0x706050403020100;
  treasure[0] = '\b';
  treasure[1] = '\t';
  ref_00 = flatbuffers_uint8_vec_create(B,(uint8_t *)((long)&weapons + 2),10);
  MyGame_Sample_Weapon_vec_start(B);
  MyGame_Sample_Weapon_vec_push(B,ref);
  MyGame_Sample_Weapon_vec_push(B,treasure._6_4_);
  ref_01 = MyGame_Sample_Weapon_vec_end(B);
  stack0xffffffffffffffb0 = 0x400000003f800000;
  equipped._2_2_ = 300;
  equipped.type = 0x96;
  equipped._1_1_ = 0;
  uref = MyGame_Sample_Equipment_as_Weapon(treasure._6_4_);
  if (flexible == 0) {
    MyGame_Sample_Monster_create_as_root
              (B,(MyGame_Sample_Vec3_t *)&equipped.value,equipped._0_2_,equipped._2_2_,
               treasure._2_4_,ref_00,'\0',ref_01,uref);
  }
  else {
    MyGame_Sample_Monster_start_as_root(B);
    MyGame_Sample_Monster_pos_create(B,1.0,2.0,3.0);
    MyGame_Sample_Monster_hp_add(B,equipped._2_2_);
    MyGame_Sample_Monster_name_add(B,treasure._2_4_);
    MyGame_Sample_Monster_inventory_add(B,ref_00);
    MyGame_Sample_Monster_color_add(B,'\0');
    MyGame_Sample_Monster_weapons_add(B,ref_01);
    MyGame_Sample_Monster_equipped_add(B,uref);
    MyGame_Sample_Monster_end_as_root(B);
  }
  return 0;
}

Assistant:

int create_monster_bottom_up(flatcc_builder_t *B, int flexible)
{
    flatbuffers_string_ref_t weapon_one_name = flatbuffers_string_create_str(B, "Sword");
    int16_t weapon_one_damage = 3;

    flatbuffers_string_ref_t weapon_two_name = flatbuffers_string_create_str(B, "Axe");
    int16_t weapon_two_damage = 5;

    // Use the `MyGame_Sample_Weapon_create` shortcut to create Weapons
    // with all the fields set.
    //
    // In the C-API, verbs (here create) always follow the type name
    // (here Weapon), prefixed by the namespace (here MyGame_Sample_):
    // MyGame_Sample_Weapon_create(...), or ns(Weapone_create(...)).
    ns(Weapon_ref_t) sword = ns(Weapon_create(B, weapon_one_name, weapon_one_damage));
    ns(Weapon_ref_t) axe = ns(Weapon_create(B, weapon_two_name, weapon_two_damage));

    // Serialize a name for our monster, called "Orc".
    // The _str suffix indicates the source is an ascii-z string.
    flatbuffers_string_ref_t name = flatbuffers_string_create_str(B, "Orc");

    // Create a `vector` representing the inventory of the Orc. Each number
    // could correspond to an item that can be claimed after he is slain.
    uint8_t treasure[] = {0, 1, 2, 3, 4, 5, 6, 7, 8, 9};
    flatbuffers_uint8_vec_ref_t inventory;
    // `c_vec_len` is the convenience macro we defined earlier.
    inventory = flatbuffers_uint8_vec_create(B, treasure, c_vec_len(treasure));

    // Here we use a top-down approach locally to build a Weapons vector
    // in-place instead of creating a temporary external vector to use
    // as argument like we did with the `inventory` earlier on, but the
    // overall approach is still bottom-up.
    ns(Weapon_vec_start(B));
    ns(Weapon_vec_push(B, sword));
    ns(Weapon_vec_push(B, axe));
    ns(Weapon_vec_ref_t) weapons = ns(Weapon_vec_end(B));


    // Create a `Vec3`, representing the Orc's position in 3-D space.
    ns(Vec3_t) pos = { 1.0f, 2.0f, 3.0f };


    // Set his hit points to 300 and his mana to 150.
    int16_t hp = 300;
    // The default value is 150, so we will never store this field.
    int16_t mana = 150;

    // Create the equipment union. In the C++ language API this is given
    // as two arguments to the create call, or as two separate add
    // operations for the type and the table reference. Here we create
    // a single union value that carries both the type and reference.
    ns(Equipment_union_ref_t) equipped = ns(Equipment_as_Weapon(axe));

    if (!flexible) {
        // Finally, create the monster using the `Monster_create` helper function
        // to set all fields.
        //
        // Note that the Equipment union only take up one argument in C, where
        // C++ takes a type and an object argument.
        ns(Monster_create_as_root(B, &pos, mana, hp, name, inventory, ns(Color_Red),
                             weapons, equipped));

        // Unlike C++ we do not use a Finish call. Instead we use the
        // `create_as_root` action which has better type safety and
        // simplicity.
        //
        // However, we can also express this as:
        //
        // ns(Monster_ref_t) orc = ns(Monster_create(B, ...));
        // flatcc_builder_buffer_create(orc);
        //
        // In this approach the function should return the orc and
        // let a calling function handle the flatcc_buffer_create call
        // for a more composable setup that is also able to create child
        // monsters. In general, `flatcc_builder` calls are best isolated
        // in a containing driver function.

    } else {

        // A more flexible approach where we mix bottom-up and top-down
        // style. We still create child objects first, but then create
        // a top-down style monster object that we can manipulate in more
        // detail.

        // It is important to pair `start_as_root` with `end_as_root`.
        ns(Monster_start_as_root(B));
        ns(Monster_pos_create(B, 1.0f, 2.0f, 3.0f));
        // or alternatively
        //ns(Monster_pos_add(&pos);

        ns(Monster_hp_add(B, hp));
        // Notice that `Monser_name_add` adds a string reference unlike the
        // add_str and add_strn variants.
        ns(Monster_name_add(B, name));
        ns(Monster_inventory_add(B, inventory));
        ns(Monster_color_add(B, ns(Color_Red)));
        ns(Monster_weapons_add(B, weapons));
        ns(Monster_equipped_add(B, equipped));
        // Complete the monster object and make it the buffer root object.
        ns(Monster_end_as_root(B));

        // We could also drop the `as_root` suffix from Monster_start/end(B)
        // and add the table as buffer root later:
        //
        // ns(Monster_ref_t) orc = ns(Monster_start(B));
        // ...
        // ns(Monster_ref_t) orc = ns(Monster_end(B));
        // flatcc_builder_buffer_create(orc);
        //
        // It is best to keep the `flatcc_builder` calls in a containing
        // driver function for modularity.
    }
    return 0;
}